

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::Texture1DArrayView::sampleCompareOffset
          (Texture1DArrayView *this,Sampler *sampler,float ref,float s,float t,float lod,
          deInt32 offset)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  int y_;
  float fVar1;
  Vector<int,_2> local_34;
  deInt32 local_2c;
  float local_28;
  deInt32 offset_local;
  float lod_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  Texture1DArrayView *this_local;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  local_2c = offset;
  local_28 = lod;
  offset_local = (deInt32)t;
  lod_local = s;
  t_local = ref;
  _s_local = sampler;
  sampler_local = (Sampler *)this;
  y_ = selectLayer(this,t);
  Vector<int,_2>::Vector(&local_34,offset,y_);
  fVar1 = sampleLevelArray1DCompare(levels,numLevels,sampler,ref,s,lod,&local_34);
  return fVar1;
}

Assistant:

float Texture1DArrayView::sampleCompareOffset (const Sampler& sampler, float ref, float s, float t, float lod, deInt32 offset) const
{
	return sampleLevelArray1DCompare(m_levels, m_numLevels, sampler, ref, s, lod, IVec2(offset, selectLayer(t)));
}